

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

PrimitiveInstantiationSyntax * __thiscall
slang::parsing::Parser::parsePrimitiveInstantiation(Parser *this,AttrList attributes)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Diagnostic *pDVar4;
  SourceLocation location;
  HierarchicalInstanceSyntax *pHVar5;
  undefined4 extraout_var;
  PrimitiveInstantiationSyntax *pPVar6;
  uint uVar7;
  __extent_storage<18446744073709551615UL> _Var8;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  DiagCode code;
  pointer ppAVar9;
  TokenKind kind;
  Token TVar10;
  SourceRange SVar11;
  string_view sVar12;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  Token local_1b8;
  DriveStrengthSyntax *local_1a8;
  Token local_1a0;
  pointer local_190;
  size_t local_188;
  SyntaxNode *local_180;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_178;
  ulong local_168;
  undefined8 uStack_160;
  size_t local_158;
  pointer local_150;
  size_t local_148;
  undefined1 local_140 [16];
  SyntaxNode *local_130;
  SyntaxNode *pSStack_128;
  pointer local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  _Var8 = attributes._M_extent._M_extent_value;
  ppAVar9 = attributes._M_ptr;
  Token::Token(&local_1b8);
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isGateType(TVar10.kind);
  if (bVar1) {
    local_1b8 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    local_1b8 = ParserBase::expect(&this->super_ParserBase,Identifier);
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar1) {
    TVar10 = ParserBase::peek(&this->super_ParserBase,1);
    bVar1 = slang::syntax::SyntaxFacts::isDriveStrength(TVar10.kind);
    if (!bVar1) goto LAB_003b23c6;
    if ((local_1b8.kind & ~EndOfFile) == PullDownKeyword) {
      local_1a8 = (DriveStrengthSyntax *)parsePullStrength(this,local_1b8);
    }
    else {
      local_1a8 = parseDriveStrength(this);
      if ((((local_1b8.kind - 0xdf < 0x2d) &&
           ((0x1f0040001001U >> ((ulong)(local_1b8.kind - 0xdf) & 0x3f) & 1) != 0)) ||
          (local_1b8.kind - 0x12f < 3)) || (local_1b8.kind == CmosKeyword)) {
        SVar11 = Token::range(&local_1b8);
        pDVar4 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x240005,SVar11);
        sVar12 = Token::valueText(&local_1b8);
        pDVar4 = Diagnostic::operator<<(pDVar4,sVar12);
        SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_1a8);
        Diagnostic::operator<<(pDVar4,SVar11);
      }
    }
  }
  else {
LAB_003b23c6:
    local_1a8 = (DriveStrengthSyntax *)0x0;
  }
  local_180 = &parseDelay3(this)->super_SyntaxNode;
  if (local_180 != (SyntaxNode *)0x0) {
    uVar2 = (uint)local_1b8.kind;
    if (local_1b8.kind < NandKeyword) {
      if (((uVar2 == 2) || (uVar2 == 99)) || (uVar2 == 0x6f)) {
LAB_003b2459:
        if ((local_180->kind == Delay3) && (local_180[4].parent != (SyntaxNode *)0x0)) {
          SVar11 = slang::syntax::SyntaxNode::sourceRange(local_180[4].parent);
          if (local_1b8.kind != Identifier) {
            code.subsystem = Parser;
            code.code = 0x1c;
            goto LAB_003b254e;
          }
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x1d0005,SVar11);
        }
      }
    }
    else {
      uVar7 = local_1b8.kind - 0xda;
      if (uVar7 < 0x32) {
        if ((0x3000000001141U >> ((ulong)uVar7 & 0x3f) & 1) != 0) goto LAB_003b2459;
        if ((0x80000c000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_003b2437;
LAB_003b253e:
        SVar11 = slang::syntax::SyntaxNode::sourceRange(local_180);
        code.subsystem = Parser;
        code.code = 0x1e;
LAB_003b254e:
        pDVar4 = ParserBase::addDiag(&this->super_ParserBase,code,SVar11);
        sVar12 = Token::valueText(&local_1b8);
        pDVar4 = Diagnostic::operator<<(pDVar4,sVar12);
        SVar11 = Token::range(&local_1b8);
        Diagnostic::operator<<(pDVar4,SVar11);
      }
      else {
LAB_003b2437:
        uVar2 = uVar2 - 0x12f;
        if (uVar2 < 0x26) {
          if ((0x3000000006U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_003b2459;
          if ((ulong)uVar2 == 0) goto LAB_003b253e;
        }
      }
    }
  }
  Token::Token(&local_1a0);
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  local_140 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(local_140._0_2_);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location((Token *)local_140);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x400005,location);
    }
    local_1a0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleInstance(local_140._0_2_);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,(Token)local_140,Semicolon,&local_1a0,(DiagCode)0x400005);
      src = extraout_RDX_03;
      goto LAB_003b2770;
    }
    local_190 = ppAVar9;
    local_188 = _Var8._M_extent_value;
    do {
      pHVar5 = parseHierarchicalInstance(this);
      local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pHVar5;
      local_168 = CONCAT71(local_168._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_178._M_first);
      TVar10 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar10.kind);
      iVar3 = 3;
      src = extraout_RDX;
      if (TVar10.kind == Comma && !bVar1) {
        local_178._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_168 = local_168 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_178._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar10.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          src = extraout_RDX_01;
        }
        else {
          src = extraout_RDX_00;
          if (((local_140._0_2_ != kind) || ((Info *)local_140._8_8_ != TVar10.info)) ||
             (bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon>
                                (&this->super_ParserBase,(DiagCode)0x400005,true),
             src = extraout_RDX_02, bVar1)) {
            iVar3 = 0;
            local_140 = (undefined1  [16])TVar10;
          }
        }
      }
      _Var8._M_extent_value = local_188;
      ppAVar9 = local_190;
    } while (iVar3 == 0);
    if (iVar3 != 3) goto LAB_003b2770;
    local_1a0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  src = local_1a0.info;
LAB_003b2770:
  TVar10 = local_1b8;
  local_178._8_4_ = 1;
  local_168 = 0;
  uStack_160 = 0;
  local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005d2a10;
  local_158 = _Var8._M_extent_value;
  local_150 = ppAVar9;
  local_148 = _Var8._M_extent_value;
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = (pointer)CONCAT44(extraout_var,iVar3);
  local_140._8_4_ = 3;
  local_130 = (SyntaxNode *)0x0;
  pSStack_128 = (SyntaxNode *)0x0;
  local_140._0_8_ = &PTR_getChild_005d29b8;
  pPVar6 = slang::syntax::SyntaxFactory::primitiveInstantiation
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_178._M_first,
                      TVar10,&local_1a8->super_NetStrengthSyntax,(TimingControlSyntax *)local_180,
                      (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)local_140,
                      local_1a0);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    operator_delete(local_108[0].data_);
  }
  return pPVar6;
}

Assistant:

PrimitiveInstantiationSyntax& Parser::parsePrimitiveInstantiation(AttrList attributes) {
    Token type;
    if (isGateType(peek().kind))
        type = consume();
    else
        type = expect(TokenKind::Identifier);

    NetStrengthSyntax* strength = nullptr;
    if (peek(TokenKind::OpenParenthesis) && isDriveStrength(peek(1).kind)) {
        if (type.kind == TokenKind::PullUpKeyword || type.kind == TokenKind::PullDownKeyword)
            strength = parsePullStrength(type);
        else {
            strength = parseDriveStrength();
            SLANG_ASSERT(strength);
            switch (type.kind) {
                case TokenKind::CmosKeyword:
                case TokenKind::RcmosKeyword:
                case TokenKind::NmosKeyword:
                case TokenKind::PmosKeyword:
                case TokenKind::RnmosKeyword:
                case TokenKind::RpmosKeyword:
                case TokenKind::TranIf0Keyword:
                case TokenKind::TranIf1Keyword:
                case TokenKind::RtranIf0Keyword:
                case TokenKind::RtranIf1Keyword:
                case TokenKind::TranKeyword:
                case TokenKind::RtranKeyword:
                    addDiag(diag::DriveStrengthNotAllowed, type.range())
                        << type.valueText() << strength->sourceRange();
                    break;
                default:
                    break;
            }
        }
    }

    auto delay = parseDelay3();
    if (delay) {
        switch (type.kind) {
            case TokenKind::PullDownKeyword:
            case TokenKind::PullUpKeyword:
            case TokenKind::TranKeyword:
            case TokenKind::RtranKeyword:
                addDiag(diag::DelaysNotAllowed, delay->sourceRange())
                    << type.valueText() << type.range();
                break;
            case TokenKind::AndKeyword:
            case TokenKind::NandKeyword:
            case TokenKind::OrKeyword:
            case TokenKind::NorKeyword:
            case TokenKind::XorKeyword:
            case TokenKind::XnorKeyword:
            case TokenKind::BufKeyword:
            case TokenKind::NotKeyword:
            case TokenKind::TranIf0Keyword:
            case TokenKind::TranIf1Keyword:
            case TokenKind::RtranIf0Keyword:
            case TokenKind::RtranIf1Keyword:
            case TokenKind::Identifier:
                if (delay->kind == SyntaxKind::Delay3) {
                    if (auto d3 = delay->as<Delay3Syntax>().delay3) {
                        auto range = d3->sourceRange();
                        if (type.kind == TokenKind::Identifier) {
                            addDiag(diag::Delay3UdpNotAllowed, range);
                        }
                        else {
                            addDiag(diag::Delay3NotAllowed, range)
                                << type.valueText() << type.range();
                        }
                    }
                }
                break;
            default:
                break;
        }
    }

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.primitiveInstantiation(attributes, type, strength, delay, items.copy(alloc),
                                          semi);
}